

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samples_test.cpp
# Opt level: O0

void __thiscall Samples_Sponge4_Test::~Samples_Sponge4_Test(Samples_Sponge4_Test *this)

{
  Samples_Sponge4_Test *this_local;
  
  ~Samples_Sponge4_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Samples, Sponge4) {
  Manifold sponge = MengerSponge(4);
  EXPECT_LE(sponge.NumDegenerateTris(), 8);
  EXPECT_EQ(sponge.Genus(), 26433);  // should be 1:5, 2:81, 3:1409, 4:26433
  CheckGL(sponge);

  std::pair<Manifold, Manifold> cutSponge = sponge.SplitByPlane({1, 1, 1}, 0);
  EXPECT_EQ(cutSponge.first.Genus(), 13394);
  EXPECT_EQ(cutSponge.second.Genus(), 13394);

  CrossSection projection(cutSponge.first.Project());
  projection = projection.Simplify(cutSponge.first.GetEpsilon());
  Rect rect = projection.Bounds();
  Box box = cutSponge.first.BoundingBox();
  EXPECT_EQ(rect.min.x, box.min.x);
  EXPECT_EQ(rect.min.y, box.min.y);
  EXPECT_EQ(rect.max.x, box.max.x);
  EXPECT_EQ(rect.max.y, box.max.y);
  EXPECT_NEAR(projection.Area(), 0.535, 0.001);
  Manifold extrusion = Manifold::Extrude(projection.ToPolygons(), 1);
  EXPECT_LE(extrusion.NumDegenerateTris(), 32);
  EXPECT_EQ(extrusion.Genus(), 502);

#ifdef MANIFOLD_EXPORT
  if (options.exportModels) {
    ExportMesh("mengerHalf.glb", cutSponge.first.GetMeshGL(), {});

    const MeshGL out = sponge
                           .SetProperties(3,
                                          [](double* newProp, vec3 pos,
                                             const double* oldProp) {
                                            for (const int i : {0, 1, 2})
                                              newProp[i] = 0.5 * (pos[i] + 0.5);
                                          })
                           .GetMeshGL();
    ExportOptions options;
    options.faceted = true;
    options.mat.roughness = 0.2;
    options.mat.metalness = 1.0;
    options.mat.colorIdx = 0;
    ExportMesh("mengerSponge.glb", out, options);
  }
#endif
  Manifold sponge2 = MengerSponge(4);
  std::pair<Manifold, Manifold> cutSponge2 = sponge2.SplitByPlane({1, 1, 1}, 0);
  CheckGLEquiv(cutSponge.first.GetMeshGL(), cutSponge2.first.GetMeshGL());
}